

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Boolean UA_Node_hasSubTypeOrInstances(UA_Node *node)

{
  ulong uVar1;
  UA_Boolean UVar2;
  size_t i;
  ulong uVar3;
  UA_NodeId *n2;
  long lVar4;
  undefined1 local_60 [8];
  UA_NodeId hasTypeDefinition;
  UA_NodeId hasSubType;
  
  hasTypeDefinition.identifier._8_2_ = 0;
  stack0xffffffffffffffbc = 0x2d00000000;
  local_60._0_2_ = 0;
  stack0xffffffffffffffa4 = 0x2800000000;
  uVar1 = node->referencesSize;
  lVar4 = 0;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    n2 = (UA_NodeId *)local_60;
    if ((&node->references->isInverse)[lVar4] == false) {
      n2 = (UA_NodeId *)((long)&hasTypeDefinition.identifier + 8);
    }
    UVar2 = UA_NodeId_equal((UA_NodeId *)
                            ((long)&(node->references->referenceTypeId).namespaceIndex + lVar4),n2);
    if (UVar2) break;
    lVar4 = lVar4 + 0x50;
  }
  return uVar3 < uVar1;
}

Assistant:

UA_Boolean
UA_Node_hasSubTypeOrInstances(const UA_Node *node) {
    const UA_NodeId hasSubType = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    const UA_NodeId hasTypeDefinition = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == false &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasSubType))
            return true;
        if(node->references[i].isInverse == true &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasTypeDefinition))
            return true;
    }
    return false;
}